

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int stb_vorbis_get_frame_short_interleaved(stb_vorbis *f,int num_c,short *buffer,int num_shorts)

{
  int len;
  int iVar1;
  float **output;
  float **local_40;
  short *local_38;
  
  local_38 = buffer;
  if (num_c == 1) {
    len = stb_vorbis_get_frame_short(f,1,&local_38,num_shorts);
  }
  else {
    len = 0;
    iVar1 = stb_vorbis_get_frame_float(f,(int *)0x0,&local_40);
    if (iVar1 != 0) {
      len = iVar1;
      if (num_shorts < iVar1 * num_c) {
        len = num_shorts / num_c;
      }
      convert_channels_short_interleaved(num_c,buffer,f->channels,local_40,0,len);
    }
  }
  return len;
}

Assistant:

int stb_vorbis_get_frame_short_interleaved(stb_vorbis *f, int num_c, short *buffer, int num_shorts)
{
   float **output;
   int len;
   if (num_c == 1) return stb_vorbis_get_frame_short(f,num_c,&buffer, num_shorts);
   len = stb_vorbis_get_frame_float(f, NULL, &output);
   if (len) {
      if (len*num_c > num_shorts) len = num_shorts / num_c;
      convert_channels_short_interleaved(num_c, buffer, f->channels, output, 0, len);
   }
   return len;
}